

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O1

int Ses_ManFindNetworkExactCEGAR(Ses_Man_t *pSes,int nGates,char **pSol)

{
  ulong uVar1;
  word *__s;
  char cVar2;
  byte bVar3;
  int iVar4;
  word *pwVar5;
  ulong uVar6;
  int iVar7;
  word *pwVar8;
  ulong *puVar9;
  char *pcVar10;
  word *pwVar11;
  long lVar12;
  byte *pbVar13;
  int iVar14;
  uint uVar15;
  bool bVar16;
  word pTruth [4];
  ulong local_58 [5];
  
  if (pSes->fVeryVerbose != 0) {
    iVar14 = pSes->nDebugOffset + (uint)(10 < nGates) + 4;
    if (0 < iVar14) {
      do {
        putchar(8);
        iVar14 = iVar14 + -1;
      } while (iVar14 != 0);
    }
    fflush(_stdout);
  }
  if (pSes->fVeryVerbose != 0) {
    printf(" (%d/%d)",nGates,(ulong)(uint)pSes->nMaxGates);
    fflush(_stdout);
  }
  uVar15 = pSes->nMaxDepth;
  if (nGates < 1 << ((byte)uVar15 & 0x1f) || uVar15 == 0xffffffff) {
    if (((uVar15 == 0xffffffff) || (pSes->pArrTimeProfile == (int *)0x0)) ||
       (nGates <= pSes->nMaxGates)) {
      if ((pSes->fDecStructure == 0) || (nGates <= 1 << ((byte)uVar15 - 1 & 0x1f))) {
        if (1 << ((byte)pSes->nSpecVars & 0x1f) <= nGates) {
          if (pSes->fReasonVerbose == 0) {
            return 3;
          }
          printf("give up due to impossible number of gates");
          return 3;
        }
        if (0 < pSes->nRandRowAssigns) {
          iVar14 = 0;
          do {
            iVar4 = rand();
            lVar12 = (long)iVar4 % (long)pSes->nRows;
            pSes->pTtValues[(int)lVar12 >> 6] =
                 pSes->pTtValues[(int)lVar12 >> 6] | 1L << ((byte)lVar12 & 0x3f);
            iVar14 = iVar14 + 1;
          } while (iVar14 < pSes->nRandRowAssigns);
        }
        iVar14 = Ses_ManFindNetworkExact(pSes,nGates);
        if (iVar14 != 1) {
          return iVar14;
        }
        __s = pSes->pTtObjs;
        do {
          pcVar10 = Ses_ManExtractSolution(pSes);
          *pSol = pcVar10;
          if (pcVar10[1] != '\x01') {
            __assert_fail("pSol[ABC_EXACT_SOL_NFUNC] == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcExact.c"
                          ,0x404,"word *Ses_ManDeriveTruth(Ses_Man_t *, char *, int)");
          }
          cVar2 = pcVar10[2];
          uVar15 = (uint)cVar2;
          pbVar13 = (byte *)(pcVar10 + 3);
          memset(__s,0,(long)(int)uVar15 << 5);
          if (cVar2 < '\x01') {
            pwVar5 = (word *)0x0;
          }
          else {
            pwVar5 = __s;
            uVar1 = 0;
            do {
              uVar6 = uVar1;
              if (pbVar13[1] != 2) {
                __assert_fail("*p++ == 2",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcExact.c"
                              ,0x40d,"word *Ses_ManDeriveTruth(Ses_Man_t *, char *, int)");
              }
              iVar4 = (int)(char)pbVar13[2];
              iVar14 = pSes->nSpecVars;
              if (iVar4 < iVar14) {
                pwVar8 = s_Truths8 + (long)iVar4 * 4;
              }
              else {
                pwVar8 = __s + (iVar4 - iVar14) * 4;
              }
              iVar4 = (int)(char)pbVar13[3];
              if (iVar4 < iVar14) {
                pwVar11 = s_Truths8 + (long)iVar4 * 4;
              }
              else {
                pwVar11 = __s + (iVar4 - iVar14) * 4;
              }
              bVar3 = *pbVar13;
              if (((bVar3 & 1) != 0) && (iVar14 = pSes->nSpecWords, 0 < (long)iVar14)) {
                lVar12 = 0;
                do {
                  pwVar5[lVar12] = pwVar5[lVar12] | ~pwVar8[lVar12] & pwVar11[lVar12];
                  lVar12 = lVar12 + 1;
                } while (iVar14 != lVar12);
              }
              if (((bVar3 & 2) != 0) && (iVar14 = pSes->nSpecWords, 0 < (long)iVar14)) {
                lVar12 = 0;
                do {
                  pwVar5[lVar12] = pwVar5[lVar12] | ~pwVar11[lVar12] & pwVar8[lVar12];
                  lVar12 = lVar12 + 1;
                } while (iVar14 != lVar12);
              }
              if (((bVar3 & 4) != 0) && (iVar14 = pSes->nSpecWords, 0 < (long)iVar14)) {
                lVar12 = 0;
                do {
                  pwVar5[lVar12] = pwVar5[lVar12] | pwVar11[lVar12] & pwVar8[lVar12];
                  lVar12 = lVar12 + 1;
                } while (iVar14 != lVar12);
              }
              pbVar13 = pbVar13 + 4;
              uVar1 = uVar6 + 1;
              pwVar5 = pwVar5 + 4;
            } while (uVar1 != uVar15);
            pwVar5 = __s + uVar6 * 4;
          }
          if ((char)*pbVar13 < '\0') {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x12f,"int Abc_Lit2Var(int)");
          }
          if (uVar15 - 1 != (uint)(*pbVar13 >> 1)) {
            __assert_fail("Abc_Lit2Var( *p ) == nGates - 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcExact.c"
                          ,0x421,"word *Ses_ManDeriveTruth(Ses_Man_t *, char *, int)");
          }
          iVar14 = pSes->nSpecWords;
          if (0 < (long)iVar14) {
            pwVar8 = pSes->pSpec;
            lVar12 = 0;
            do {
              local_58[lVar12] = pwVar8[lVar12] ^ pwVar5[lVar12];
              lVar12 = lVar12 + 1;
            } while (iVar14 != lVar12);
          }
          iVar14 = pSes->nSpecVars;
          uVar15 = 1 << ((char)iVar14 - 6U & 0x1f);
          if (iVar14 < 7) {
            uVar15 = 1;
          }
          iVar4 = -1;
          if (0 < (int)uVar15) {
            puVar9 = local_58;
            lVar12 = 0;
            do {
              uVar1 = *puVar9;
              if (uVar1 != 0) {
                bVar16 = (int)uVar1 == 0;
                uVar6 = uVar1 >> 0x20;
                if (!bVar16) {
                  uVar6 = uVar1;
                }
                iVar7 = (uint)bVar16 * 0x20;
                iVar4 = iVar7 + 0x10;
                uVar1 = uVar6 >> 0x10;
                if ((short)uVar6 != 0) {
                  iVar4 = iVar7;
                  uVar1 = uVar6;
                }
                iVar7 = iVar4 + 8;
                uVar6 = uVar1 >> 8;
                if ((char)uVar1 != '\0') {
                  iVar7 = iVar4;
                  uVar6 = uVar1;
                }
                iVar4 = iVar7 + 4;
                uVar1 = uVar6 >> 4;
                if ((uVar6 & 0xf) != 0) {
                  iVar4 = iVar7;
                  uVar1 = uVar6;
                }
                uVar15 = (uint)(uVar1 >> 2) & 0x3fffffff;
                iVar7 = iVar4 + 2;
                if ((uVar1 & 3) != 0) {
                  uVar15 = (uint)uVar1;
                  iVar7 = iVar4;
                }
                iVar4 = ((~uVar15 & 1) + iVar7) - (int)lVar12;
                break;
              }
              lVar12 = lVar12 + -0x40;
              puVar9 = puVar9 + 1;
            } while ((ulong)uVar15 * 0x40 + lVar12 != 0);
          }
          if (iVar4 == -1) {
            return 1;
          }
          if ((iVar14 < 6) && (pSes->nRows < iVar4)) {
            return 1;
          }
          if (*pSol != (char *)0x0) {
            free(*pSol);
            *pSol = (char *)0x0;
          }
          if (pSes->fKeepRowAssigns != 0) {
            pSes->pTtValues[iVar4 + -1 >> 6] =
                 pSes->pTtValues[iVar4 + -1 >> 6] | 1L << ((byte)(iVar4 + -1) & 0x3f);
          }
          iVar14 = Ses_ManCreateTruthTableClause(pSes,iVar4 + -1);
          if (iVar14 == 0) {
            return 2;
          }
          iVar14 = Ses_ManSolve(pSes);
          if (iVar14 != 1) {
            return (uint)(iVar14 != 2) * 2;
          }
        } while( true );
      }
      if (pSes->fReasonVerbose == 0) {
        return 3;
      }
      pcVar10 = "give up due to impossible depth in AND-dec structure (depth = %d, gates = %d)";
    }
    else {
      if (pSes->fReasonVerbose == 0) {
        return 3;
      }
      pcVar10 = "give up due to impossible depth and arrival times (depth = %d, gates = %d)";
    }
  }
  else {
    if (pSes->fReasonVerbose == 0) {
      return 3;
    }
    pcVar10 = "give up due to impossible depth (depth = %d, gates = %d)";
  }
  printf(pcVar10,(ulong)uVar15,nGates);
  return 3;
}

Assistant:

static int Ses_ManFindNetworkExactCEGAR( Ses_Man_t * pSes, int nGates, char ** pSol )
{
    int fRes, iMint, fSat, i;
    word pTruth[4];

    /* debug */
    Abc_DebugErase( pSes->nDebugOffset + ( nGates > 10 ? 5 : 4 ), pSes->fVeryVerbose );
    Abc_DebugPrintIntInt( " (%d/%d)", nGates, pSes->nMaxGates, pSes->fVeryVerbose );

    /* do #gates and max depth allow for a network? */
    if ( !Ses_CheckGatesConsistency( pSes, nGates ) )
        return 3;

    for ( i = 0; i < pSes->nRandRowAssigns; ++i )
        Abc_TtSetBit( pSes->pTtValues, rand() % pSes->nRows );

    fRes = Ses_ManFindNetworkExact( pSes, nGates );
    if ( fRes != 1 ) return fRes;

    while ( true )
    {
        *pSol = Ses_ManExtractSolution( pSes );
        Abc_TtXor( pTruth, Ses_ManDeriveTruth( pSes, *pSol, 0 ), pSes->pSpec, pSes->nSpecWords, 0 );
        iMint = Abc_TtFindFirstBit( pTruth, pSes->nSpecVars );

        if ( iMint == -1 || (pSes->nSpecVars < 6 && iMint > pSes->nRows) )
        {
            assert( fRes == 1 );
            return 1;
        }
        ABC_FREE( *pSol );

        if ( pSes->fKeepRowAssigns )
            Abc_TtSetBit( pSes->pTtValues, iMint - 1 );
        if ( !Ses_ManCreateTruthTableClause( pSes, iMint - 1 ) ) /* UNSAT, continue */
            return 2;

        if ( ( fSat = Ses_ManSolve( pSes ) ) == 1 ) continue;

        return ( fSat == 2 ) ? 0 : 2;
    }
}